

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,unsigned_int>
          (BaseAppender *this,Vector *col,uchar input)

{
  bool bVar1;
  InvalidInputException *this_00;
  uchar input_00;
  uint result;
  uint32_t local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_char,unsigned_int>(input,&local_3c,false);
  if (bVar1) {
    *(uint32_t *)(col->data + (this->chunk).count * 4) = local_3c;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_char,unsigned_int>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}